

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt.c
# Opt level: O0

dropt_char * dropt_get_error_message(dropt_context *context)

{
  dropt_char *pdVar1;
  dropt_context *local_20;
  dropt_context *context_local;
  
  if (context == (dropt_context *)0x0) {
    dropt_misuse("No dropt context specified.",
                 "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt.c"
                 ,0x292);
    context_local = (dropt_context *)0x1062b4;
  }
  else if ((context->errorDetails).err == 0) {
    context_local = (dropt_context *)0x1062b4;
  }
  else {
    if ((context->errorDetails).message == (dropt_char *)0x0) {
      if (context->errorHandler == (dropt_error_handler_func)0x0) {
        pdVar1 = dropt_default_error_handler
                           ((context->errorDetails).err,(context->errorDetails).optionName,
                            (context->errorDetails).optionArgument);
        (context->errorDetails).message = pdVar1;
      }
      else {
        pdVar1 = (*context->errorHandler)
                           ((context->errorDetails).err,(context->errorDetails).optionName,
                            (context->errorDetails).optionArgument,context->errorHandlerData);
        (context->errorDetails).message = pdVar1;
      }
    }
    if ((context->errorDetails).message == (dropt_char *)0x0) {
      local_20 = (dropt_context *)0x106092;
    }
    else {
      local_20 = (dropt_context *)(context->errorDetails).message;
    }
    context_local = local_20;
  }
  return (dropt_char *)context_local;
}

Assistant:

const dropt_char*
dropt_get_error_message(dropt_context* context)
{
    if (context == NULL)
    {
        DROPT_MISUSE("No dropt context specified.");
        return DROPT_TEXT_LITERAL("");
    }

    if (context->errorDetails.err == dropt_error_none)
    {
        return DROPT_TEXT_LITERAL("");
    }

    if (context->errorDetails.message == NULL)
    {
        if (context->errorHandler != NULL)
        {
            context->errorDetails.message
                = context->errorHandler(context->errorDetails.err,
                                        context->errorDetails.optionName,
                                        context->errorDetails.optionArgument,
                                        context->errorHandlerData);
        }
        else
        {
#ifndef DROPT_NO_STRING_BUFFERS
            context->errorDetails.message
                = dropt_default_error_handler(context->errorDetails.err,
                                              context->errorDetails.optionName,
                                              context->errorDetails.optionArgument);
#endif
        }
    }

    return (context->errorDetails.message == NULL)
           ? DROPT_TEXT_LITERAL("Unknown error")
           : context->errorDetails.message;
}